

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::BoolLiteral::tokenize(BoolLiteral *this,GeneratorState *state,TokenStream *str)

{
  bool value;
  VariableType *type;
  ConstStridedValueAccess<64> local_40;
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  BoolLiteral *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  type = VariableType::getScalarType(TYPE_BOOL);
  local_40 = ValueStorage<64>::getValue(&this->m_value,type);
  value = ConstStridedValueAccess<64>::asBool(&local_40,0);
  Token::Token(&local_30,value);
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  return;
}

Assistant:

void BoolLiteral::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_UNREF(state);
	str << Token(m_value.getValue(VariableType::getScalarType(VariableType::TYPE_BOOL)).asBool(0));
}